

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_frequency_cepstral_coefficients_analysis.cc
# Opt level: O2

void __thiscall
sptk::MelFrequencyCepstralCoefficientsAnalysis::MelFrequencyCepstralCoefficientsAnalysis
          (MelFrequencyCepstralCoefficientsAnalysis *this,int fft_length,int num_channel,
          int num_order,int liftering_coefficient,double sampling_rate,double lowest_frequency,
          double highest_frequency,double floor)

{
  pointer pdVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  
  this->_vptr_MelFrequencyCepstralCoefficientsAnalysis =
       (_func_int **)&PTR__MelFrequencyCepstralCoefficientsAnalysis_00118690;
  this->num_order_ = num_order;
  this->liftering_coefficient_ = liftering_coefficient;
  MelFilterBankAnalysis::MelFilterBankAnalysis
            (&this->mel_filter_bank_analysis_,fft_length,num_channel,sampling_rate,lowest_frequency,
             highest_frequency,floor,false);
  DiscreteCosineTransform::DiscreteCosineTransform(&this->discrete_cosine_transform_,num_channel);
  this->is_valid_ = true;
  (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((this->num_order_ < num_channel) && (0 < this->liftering_coefficient_)) &&
     ((this->mel_filter_bank_analysis_).is_valid_ == true)) {
    iVar2 = (*((this->discrete_cosine_transform_).fourier_transform_.fourier_transform_)->
              _vptr_FourierTransformInterface[3])();
    if ((char)iVar2 != '\0') {
      std::vector<double,_std::allocator<double>_>::resize
                (&this->cepstal_weights_,(long)this->num_order_);
      pdVar1 = (this->cepstal_weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = 0;
      while (lVar3 < this->num_order_) {
        iVar2 = this->liftering_coefficient_;
        dVar4 = sin(((double)(int)(lVar3 + 1) * 3.141592653589793) / (double)iVar2);
        pdVar1[lVar3] = dVar4 * (double)iVar2 * 0.5 + 1.0;
        lVar3 = lVar3 + 1;
      }
      return;
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

MelFrequencyCepstralCoefficientsAnalysis::
    MelFrequencyCepstralCoefficientsAnalysis(
        int fft_length, int num_channel, int num_order,
        int liftering_coefficient, double sampling_rate,
        double lowest_frequency, double highest_frequency, double floor)
    : num_order_(num_order),
      liftering_coefficient_(liftering_coefficient),
      mel_filter_bank_analysis_(fft_length, num_channel, sampling_rate,
                                lowest_frequency, highest_frequency, floor,
                                false),
      discrete_cosine_transform_(num_channel),
      is_valid_(true) {
  if (num_channel <= num_order_ || liftering_coefficient_ <= 0 ||
      !mel_filter_bank_analysis_.IsValid() ||
      !discrete_cosine_transform_.IsValid()) {
    is_valid_ = false;
    return;
  }

  cepstal_weights_.resize(num_order_);
  double* w(&(cepstal_weights_[0]));
  for (int m(0); m < num_order_; ++m) {
    const double theta(sptk::kPi * (m + 1) / liftering_coefficient_);
    w[m] = 1.0 + 0.5 * liftering_coefficient_ * std::sin(theta);
  }
}